

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O3

ProgramData * __thiscall
deqp::gles2::Performance::anon_unknown_1::LoopInvariantCodeMotionCase::generateProgramData
          (ProgramData *__return_storage_ptr__,LoopInvariantCodeMotionCase *this,bool optimized)

{
  CaseShaderType CVar1;
  char *pcVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  int iVar6;
  ulong *puVar7;
  long *plVar8;
  size_type *psVar9;
  long *unaff_RBP;
  ulong uVar10;
  ulong *unaff_R12;
  ulong *unaff_R13;
  long *unaff_R15;
  string statements;
  long *local_350;
  undefined8 local_348;
  long local_340;
  undefined8 uStack_338;
  ulong *local_330;
  long local_328;
  ulong local_320;
  long lStack_318;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  float local_2cc;
  ulong *local_2c8;
  undefined8 local_2c0;
  ulong local_2b8;
  undefined8 uStack_2b0;
  long *local_2a8;
  undefined8 local_2a0;
  long local_298;
  undefined8 uStack_290;
  ulong *local_288;
  long local_280;
  ulong local_278 [2];
  ulong *local_268;
  long local_260;
  ulong local_258 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_2cc = 0.0;
  if (0 < this->m_numLoopIterations) {
    iVar6 = 0;
    do {
      local_2cc = local_2cc + (float)iVar6 * 3.2 + 4.6;
      iVar6 = iVar6 + 1;
    } while (this->m_numLoopIterations != iVar6);
  }
  CVar1 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  if (CVar1 == CASESHADERTYPE_FRAGMENT) {
    pcVar2 = local_248.field_2._M_local_buf + 7;
    local_248.field_2._M_local_buf[4] = 'u';
    local_248.field_2._M_allocated_capacity._5_2_ = 0x706d;
    local_248.field_2._M_allocated_capacity._0_4_ = 0x6964656d;
    local_248._M_string_length = 7;
  }
  else {
    if (CVar1 != CASESHADERTYPE_VERTEX) {
      uVar5 = std::__throw_logic_error("basic_string::_M_construct null not valid");
      if (local_350 != &local_340) {
        operator_delete(local_350,local_340 + 1);
      }
      if (local_288 != local_278) {
        operator_delete(local_288,local_278[0] + 1);
      }
      if (local_2f0 != unaff_R13) {
        operator_delete(local_2f0,local_2e0 + 1);
      }
      if (local_208 != unaff_RBP) {
        operator_delete(local_208,local_1f8 + 1);
      }
      if (local_228 != unaff_R15) {
        operator_delete(local_228,local_218 + 1);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      if (local_268 != local_258) {
        operator_delete(local_268,local_258[0] + 1);
      }
      if (local_310 != &local_300) {
        operator_delete(local_310,local_300 + 1);
      }
      if (local_2c8 != unaff_R12) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_330 != &local_320) {
        operator_delete(local_330,local_320 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT17(local_248.field_2._M_local_buf[7],
                                 CONCAT25(local_248.field_2._M_allocated_capacity._5_2_,
                                          CONCAT14(local_248.field_2._M_local_buf[4],
                                                   local_248.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      _Unwind_Resume(uVar5);
    }
    pcVar2 = local_248.field_2._M_local_buf + 5;
    local_248.field_2._M_local_buf[4] = 'p';
    local_248.field_2._M_allocated_capacity._0_4_ = 0x68676968;
    local_248._M_string_length = 5;
  }
  local_2cc = 1.0 / local_2cc;
  *pcVar2 = '\0';
  if (optimized) {
    std::operator+(&local_1c8,"\t",&local_248);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    local_330 = &local_320;
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_320 = *puVar7;
      lStack_318 = plVar3[3];
    }
    else {
      local_320 = *puVar7;
      local_330 = (ulong *)*plVar3;
    }
    local_328 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_248._M_dataplus._M_p);
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_2b8 = *puVar7;
      uStack_2b0 = puVar4[3];
      local_2c8 = &local_2b8;
    }
    else {
      local_2b8 = *puVar7;
      local_2c8 = (ulong *)*puVar4;
    }
    local_2c0 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_300 = *puVar7;
      lStack_2f8 = plVar3[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar7;
      local_310 = (ulong *)*plVar3;
    }
    local_308 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,this->m_numLoopIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar10 = 0xf;
    if (local_310 != &local_300) {
      uVar10 = local_300;
    }
    if (uVar10 < (ulong)(local_260 + local_308)) {
      uVar10 = 0xf;
      if (local_268 != local_258) {
        uVar10 = local_258[0];
      }
      if (uVar10 < (ulong)(local_260 + local_308)) goto LAB_0041d315;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_310);
    }
    else {
LAB_0041d315:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_268);
    }
    local_2a8 = &local_298;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_298 = *plVar3;
      uStack_290 = puVar4[3];
    }
    else {
      local_298 = *plVar3;
      local_2a8 = (long *)*puVar4;
    }
    local_2a0 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_218 = *plVar8;
      lStack_210 = plVar3[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *plVar8;
      local_228 = (long *)*plVar3;
    }
    local_220 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_228,(ulong)local_248._M_dataplus._M_p);
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_1f8 = *plVar8;
      lStack_1f0 = plVar3[3];
      local_208 = &local_1f8;
    }
    else {
      local_1f8 = *plVar8;
      local_208 = (long *)*plVar3;
    }
    local_200 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_208);
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_2e0 = *puVar7;
      lStack_2d8 = plVar3[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0 = *puVar7;
      local_2f0 = (ulong *)*plVar3;
    }
    local_2e8 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<double>((double)local_2cc);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar10 = 0xf;
    if (local_2f0 != &local_2e0) {
      uVar10 = local_2e0;
    }
    if (uVar10 < (ulong)(local_280 + local_2e8)) {
      uVar10 = 0xf;
      if (local_288 != local_278) {
        uVar10 = local_278[0];
      }
      if (uVar10 < (ulong)(local_280 + local_2e8)) goto LAB_0041d879;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_2f0);
    }
    else {
LAB_0041d879:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_288);
    }
    local_350 = &local_340;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_340 = *plVar3;
      uStack_338 = puVar4[3];
    }
    else {
      local_340 = *plVar3;
      local_350 = (long *)*puVar4;
    }
    local_348 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    psVar9 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_1e8.field_2._M_allocated_capacity = *psVar9;
      local_1e8.field_2._8_8_ = puVar4[3];
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar9;
      local_1e8._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_1e8._M_string_length = puVar4[1];
    *puVar4 = psVar9;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    if (local_350 != &local_340) {
      operator_delete(local_350,local_340 + 1);
    }
    if (local_288 != local_278) {
      operator_delete(local_288,local_278[0] + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_268 != local_258) {
      operator_delete(local_268,local_258[0] + 1);
    }
    if (local_310 != &local_300) {
      operator_delete(local_310,local_300 + 1);
    }
    local_258[0] = local_2b8;
    local_268 = local_2c8;
    if (local_2c8 == &local_2b8) goto LAB_0041dc17;
  }
  else {
    std::operator+(&local_1c8,"\t",&local_248);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_320 = *puVar7;
      lStack_318 = puVar4[3];
      local_330 = &local_320;
    }
    else {
      local_320 = *puVar7;
      local_330 = (ulong *)*puVar4;
    }
    local_328 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,this->m_numLoopIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar10 = 0xf;
    if (local_330 != &local_320) {
      uVar10 = local_320;
    }
    if (uVar10 < (ulong)(local_260 + local_328)) {
      uVar10 = 0xf;
      if (local_268 != local_258) {
        uVar10 = local_258[0];
      }
      if (uVar10 < (ulong)(local_260 + local_328)) goto LAB_0041d1e1;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_0041d1e1:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_268);
    }
    local_2c8 = &local_2b8;
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_2b8 = *puVar7;
      uStack_2b0 = puVar4[3];
    }
    else {
      local_2b8 = *puVar7;
      local_2c8 = (ulong *)*puVar4;
    }
    local_2c0 = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)puVar7 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    local_310 = &local_300;
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_300 = *puVar7;
      lStack_2f8 = plVar3[3];
    }
    else {
      local_300 = *puVar7;
      local_310 = (ulong *)*plVar3;
    }
    local_308 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_248._M_dataplus._M_p);
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_298 = *plVar3;
      uStack_290 = puVar4[3];
      local_2a8 = &local_298;
    }
    else {
      local_298 = *plVar3;
      local_2a8 = (long *)*puVar4;
    }
    local_2a0 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_218 = *plVar8;
      lStack_210 = plVar3[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *plVar8;
      local_228 = (long *)*plVar3;
    }
    local_220 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_228,(ulong)local_248._M_dataplus._M_p);
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_1f8 = *plVar8;
      lStack_1f0 = plVar3[3];
      local_208 = &local_1f8;
    }
    else {
      local_1f8 = *plVar8;
      local_208 = (long *)*plVar3;
    }
    local_200 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_208);
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_2e0 = *puVar7;
      lStack_2d8 = plVar3[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0 = *puVar7;
      local_2f0 = (ulong *)*plVar3;
    }
    local_2e8 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<double>((double)local_2cc);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar10 = 0xf;
    if (local_2f0 != &local_2e0) {
      uVar10 = local_2e0;
    }
    if (uVar10 < (ulong)(local_280 + local_2e8)) {
      uVar10 = 0xf;
      if (local_288 != local_278) {
        uVar10 = local_278[0];
      }
      if (uVar10 < (ulong)(local_280 + local_2e8)) goto LAB_0041d628;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_2f0);
    }
    else {
LAB_0041d628:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_288);
    }
    local_350 = &local_340;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_340 = *plVar3;
      uStack_338 = puVar4[3];
    }
    else {
      local_340 = *plVar3;
      local_350 = (long *)*puVar4;
    }
    local_348 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_350);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    psVar9 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_1e8.field_2._M_allocated_capacity = *psVar9;
      local_1e8.field_2._8_8_ = plVar3[3];
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar9;
      local_1e8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_1e8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_350 != &local_340) {
      operator_delete(local_350,local_340 + 1);
    }
    if (local_288 != local_278) {
      operator_delete(local_288,local_278[0] + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_310 != &local_300) {
      operator_delete(local_310,local_300 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_268 == local_258) goto LAB_0041dc17;
  }
  operator_delete(local_268,local_258[0] + 1);
LAB_0041dc17:
  if (local_330 != &local_320) {
    operator_delete(local_330,local_320 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  local_1a8[0]._M_string_length = 0;
  local_1a8[0].field_2._M_local_buf[0] = '\0';
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     local_1a8,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                             local_1a8[0].field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT17(local_248.field_2._M_local_buf[7],
                             CONCAT25(local_248.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_248.field_2._M_local_buf[4],
                                               local_248.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		float scale = 0.0f;
		for (int i = 0; i < m_numLoopIterations; i++)
			scale += 3.2f*(float)i + 4.6f;
		scale = 1.0f / scale;

		const string precision		= getShaderPrecision(m_caseShaderType);
		const string statements		= optimized ?	"	" + precision + " vec4 valueOrig = value;\n"
													"	" + precision + " vec4 y = sin(cos(sin(valueOrig)));\n"
													"	for (int i = 0; i < " + toString(m_numLoopIterations) + "; i++)\n"
													"	{\n"
													"		" + precision + " float x = 3.2*float(i) + 4.6;\n"
													"		value += x*y;\n"
													"	}\n"
													"	value *= " + toString(scale) + ";\n"

												:	"	" + precision + " vec4 valueOrig = value;\n"
													"	for (int i = 0; i < " + toString(m_numLoopIterations) + "; i++)\n"
													"	{\n"
													"		" + precision + " float x = 3.2*float(i) + 4.6;\n"
													"		" + precision + " vec4 y = sin(cos(sin(valueOrig)));\n"
													"		value += x*y;\n"
													"	}\n"
													"	value *= " + toString(scale) + ";\n";

		return defaultProgramData(m_caseShaderType, statements);
	}